

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__writer.cc
# Opt level: O1

bool __thiscall xemmai::io::t_writer::f_resume(t_writer *this,t_io *a_library)

{
  t_queue<128UL> *ptVar1;
  bool bVar2;
  pthread_rwlock_t *__rwlock;
  wchar_t *in_RDX;
  wchar_t *extraout_RDX;
  wchar_t *pwVar3;
  xemmai *this_00;
  long in_FS_OFFSET;
  wstring_view a_message;
  wstring_view a_message_00;
  wstring_view a_message_01;
  
  ptVar1 = (this->super_t_sharable).super_t_owned.v_owner;
  if (ptVar1 == *(t_queue<128UL> **)(in_FS_OFFSET + -0x68)) {
    if ((this->v_stream).v_p._M_b._M_p != (__pointer_type)0x0) {
      bVar2 = f__resume(this,a_library);
      return bVar2;
    }
    a_message_01._M_str = in_RDX;
    a_message_01._M_len = (size_t)L"already closed.";
    f_throw((xemmai *)0xf,a_message_01);
  }
  if (ptVar1 == (t_queue<128UL> *)0x0) {
    __rwlock = (pthread_rwlock_t *)
               t_lock_with_safe_region<std::shared_mutex>::f_lock(&(this->super_t_sharable).v_mutex)
    ;
    if ((this->super_t_sharable).super_t_owned.v_owner == (t_queue<128UL> *)0x0) {
      if ((this->v_stream).v_p._M_b._M_p != (__pointer_type)0x0) {
        bVar2 = f__resume(this,a_library);
        pthread_rwlock_unlock(__rwlock);
        return bVar2;
      }
      pwVar3 = L"already closed.";
      this_00 = (xemmai *)0xf;
    }
    else {
      pwVar3 = L"owned by another thread.";
      this_00 = (xemmai *)0x18;
    }
    a_message_00._M_str = extraout_RDX;
    a_message_00._M_len = (size_t)pwVar3;
    f_throw(this_00,a_message_00);
  }
  a_message._M_str = in_RDX;
  a_message._M_len = (size_t)L"owned by another thread.";
  f_throw((xemmai *)0x18,a_message);
}

Assistant:

bool t_writer::f_resume(t_io* a_library)
{
	return f_owned_or_shared<t_lock_with_safe_region>([&]
	{
		if (!v_stream) f_throw(L"already closed."sv);
		return f__resume(a_library);
	});
}